

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool handle_compress(bz_stream *strm)

{
  EState *s_00;
  byte bVar1;
  Bool BVar2;
  long in_RDI;
  EState *s;
  Bool progress_out;
  Bool progress_in;
  Bool in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined6 in_stack_fffffffffffffff0;
  byte bVar3;
  byte bVar4;
  
  bVar4 = 0;
  bVar3 = 0;
  s_00 = *(EState **)(in_RDI + 0x30);
  do {
    while( true ) {
      while( true ) {
        do {
          if (s_00->state == 1) {
            bVar1 = copy_output_until_stop(s_00);
            bVar3 = bVar3 | bVar1;
            if ((s_00->state_out_pos < s_00->numZ) ||
               (((s_00->mode == 4 && (s_00->avail_in_expect == 0)) &&
                (BVar2 = isempty_RL(s_00), BVar2 != '\0')))) goto LAB_0011628b;
            prepare_new_block(s_00);
            s_00->state = 2;
            if (((s_00->mode == 3) && (s_00->avail_in_expect == 0)) &&
               (BVar2 = isempty_RL(s_00), BVar2 != '\0')) goto LAB_0011628b;
          }
        } while (s_00->state != 2);
        bVar1 = copy_input_until_stop
                          ((EState *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_fffffffffffffff0)));
        bVar4 = bVar4 | bVar1;
        if ((s_00->mode == 2) || (s_00->avail_in_expect != 0)) break;
        flush_RL((EState *)0x116218);
        BZ2_compressBlock((EState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdf);
        s_00->state = 1;
      }
      if (s_00->nblock < s_00->nblockMAX) break;
      BZ2_compressBlock((EState *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdf);
      s_00->state = 1;
    }
  } while (s_00->strm->avail_in != 0);
LAB_0011628b:
  return bVar4 != 0 || bVar3 != 0;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = strm->state;

   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}